

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ClockingDirectionSyntax *args_2;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *args_3;
  ClockingItemSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  not_null<slang::syntax::ClockingDirectionSyntax_*>::operator*
            ((not_null<slang::syntax::ClockingDirectionSyntax_*> *)0x58da3e);
  args_2 = deepClone<slang::syntax::ClockingDirectionSyntax>
                     ((ClockingDirectionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  args_3 = deepClone<slang::syntax::AttributeSpecSyntax>(in_stack_00000110,in_stack_00000108);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ClockingDirectionSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>&,slang::parsing::Token>
                     (this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,
                      TVar2._0_8_,(SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)args_2,
                      (Token *)args_3);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingItemSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<ClockingDirectionSyntax>(*node.direction, alloc),
        *deepClone(node.decls, alloc),
        node.semi.deepClone(alloc)
    );
}